

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand
          (cmGlobalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeCommand,string *makeProgram,string *param_3,string *param_4,string *targetName,
          string *param_6,bool fast,bool param_8,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppcVar2;
  cmake *pcVar3;
  pointer pcVar4;
  undefined8 uVar5;
  int iVar6;
  cmMakefile *this_00;
  cmState *this_01;
  char *pcVar7;
  size_type sVar8;
  cmOutputConverter conv;
  cmStateSnapshot snapshot;
  allocator local_c1;
  undefined1 local_c0 [40];
  string local_98;
  undefined1 local_78 [40];
  string local_50;
  
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  cmGlobalGenerator::SelectMakeProgram
            ((string *)local_c0,(cmGlobalGenerator *)this,makeProgram,&local_98);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
            (local_c0,this);
  uVar5 = local_c0._0_8_;
  iVar6 = strncmp((char *)local_c0._0_8_,"NMake Makefiles",0xf);
  if ((undefined1 *)uVar5 != local_c0 + 0x10) {
    operator_delete((void *)uVar5,local_c0._16_8_ + 1);
  }
  if (iVar6 == 0) {
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"/NOLOGO","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
             (makeCommand->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  sVar8 = targetName->_M_string_length;
  if (sVar8 != 0) {
    ppcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppcVar2 ==
        (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar3 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
      local_78._16_8_ = (pcVar3->CurrentSnapshot).Position.Position;
      local_78._0_8_ = (pcVar3->CurrentSnapshot).State;
      local_78._8_8_ = (pcVar3->CurrentSnapshot).Position.Tree;
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_c0,(cmStateSnapshot *)local_78);
      pcVar7 = cmake::GetHomeDirectory
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      std::__cxx11::string::string((string *)&local_98,pcVar7,(allocator *)&local_50);
      cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_c0,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_c0,(cmStateSnapshot *)local_78);
      pcVar7 = cmake::GetHomeOutputDirectory
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      std::__cxx11::string::string((string *)&local_98,pcVar7,(allocator *)&local_50);
      cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_c0,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_78);
      this_00 = (cmMakefile *)operator_new(0x760);
      cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)this,(cmStateSnapshot *)local_78);
      sVar8 = targetName->_M_string_length;
    }
    else {
      this_00 = *ppcVar2;
    }
    local_c0._0_8_ = local_c0 + 0x10;
    pcVar4 = (targetName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)local_c0,pcVar4,pcVar4 + sVar8);
    if (fast) {
      std::__cxx11::string::append(local_c0);
    }
    cmMakefile::GetStateSnapshot(this_00);
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)&local_98,(cmStateSnapshot *)local_78)
    ;
    this_01 = cmMakefile::GetState(this_00);
    pcVar7 = cmState::GetBinaryDirectory(this_01);
    std::__cxx11::string::string((string *)&local_50,pcVar7,&local_c1);
    cmOutputConverter::ConvertToRelativePath
              ((string *)local_78,(cmOutputConverter *)&local_98,&local_50,(string *)local_c0);
    std::__cxx11::string::operator=((string *)local_c0,(string *)local_78);
    if ((cmState *)local_78._0_8_ != (cmState *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::ConvertToOutputSlashes((string *)local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(makeCommand,(value_type *)local_c0);
    if ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      cmMakefile::~cmMakefile(this_00);
      operator_delete(this_00,0x760);
    }
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::GenerateBuildCommand(
  std::vector<std::string>& makeCommand, const std::string& makeProgram,
  const std::string& /*projectName*/, const std::string& /*projectDir*/,
  const std::string& targetName, const std::string& /*config*/, bool fast,
  bool /*verbose*/, std::vector<std::string> const& makeOptions)
{
  makeCommand.push_back(this->SelectMakeProgram(makeProgram));

  // Since we have full control over the invocation of nmake, let us
  // make it quiet.
  if (cmHasLiteralPrefix(this->GetName(), "NMake Makefiles")) {
    makeCommand.push_back("/NOLOGO");
  }
  makeCommand.insert(makeCommand.end(), makeOptions.begin(),
                     makeOptions.end());
  if (!targetName.empty()) {
    cmMakefile* mf;
    if (!this->Makefiles.empty()) {
      mf = this->Makefiles[0];
    } else {
      cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();
      snapshot.GetDirectory().SetCurrentSource(
        this->CMakeInstance->GetHomeDirectory());
      snapshot.GetDirectory().SetCurrentBinary(
        this->CMakeInstance->GetHomeOutputDirectory());
      snapshot.SetDefaultDefinitions();
      mf = new cmMakefile(this, snapshot);
    }

    std::string tname = targetName;
    if (fast) {
      tname += "/fast";
    }
    cmOutputConverter conv(mf->GetStateSnapshot());
    tname =
      conv.ConvertToRelativePath(mf->GetState()->GetBinaryDirectory(), tname);
    cmSystemTools::ConvertToOutputSlashes(tname);
    makeCommand.push_back(tname);
    if (this->Makefiles.empty()) {
      delete mf;
    }
  }
}